

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sweep.cc
# Opt level: O0

void __thiscall p2t::Sweep::FillBasinReq(Sweep *this,SweepContext *tcx,Node *node)

{
  bool bVar1;
  Orientation OVar2;
  Orientation o_1;
  Orientation o;
  Node *node_local;
  SweepContext *tcx_local;
  Sweep *this_local;
  
  bVar1 = IsShallow(this,tcx,node);
  if ((!bVar1) &&
     ((Fill(this,tcx,node), node->prev != (tcx->basin).left_node ||
      (node->next != (tcx->basin).right_node)))) {
    if (node->prev == (tcx->basin).left_node) {
      OVar2 = Orient2d(node->point,node->next->point,node->next->next->point);
      if (OVar2 == CW) {
        return;
      }
      _o_1 = node->next;
    }
    else if (node->next == (tcx->basin).right_node) {
      OVar2 = Orient2d(node->point,node->prev->point,node->prev->prev->point);
      if (OVar2 == CCW) {
        return;
      }
      _o_1 = node->prev;
    }
    else if (node->next->point->y <= node->prev->point->y) {
      _o_1 = node->next;
    }
    else {
      _o_1 = node->prev;
    }
    FillBasinReq(this,tcx,_o_1);
  }
  return;
}

Assistant:

void Sweep::FillBasinReq(SweepContext& tcx, Node* node)
{
  // if shallow stop filling
  if (IsShallow(tcx, *node)) {
    return;
  }

  Fill(tcx, *node);

  if (node->prev == tcx.basin.left_node && node->next == tcx.basin.right_node) {
    return;
  } else if (node->prev == tcx.basin.left_node) {
    Orientation o = Orient2d(*node->point, *node->next->point, *node->next->next->point);
    if (o == CW) {
      return;
    }
    node = node->next;
  } else if (node->next == tcx.basin.right_node) {
    Orientation o = Orient2d(*node->point, *node->prev->point, *node->prev->prev->point);
    if (o == CCW) {
      return;
    }
    node = node->prev;
  } else {
    // Continue with the neighbor node with lowest Y value
    if (node->prev->point->y < node->next->point->y) {
      node = node->prev;
    } else {
      node = node->next;
    }
  }

  FillBasinReq(tcx, node);
}